

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::member_attribute_qualifier_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t index)

{
  char *pcVar1;
  BuiltIn BVar2;
  bool bVar3;
  uint32_t uVar4;
  TypedID *this_00;
  size_type sVar5;
  CompilerError *pCVar6;
  TypedID<(spirv_cross::Types)1> *pTVar7;
  SPIRType *pSVar8;
  ulong uVar9;
  char (*in_R8) [4];
  char (*in_stack_fffffffffffff598) [4];
  bool local_a31;
  bool local_99a;
  allocator local_82a;
  allocator local_829;
  string local_828;
  allocator local_801;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e0;
  allocator local_7bd;
  uint32_t local_7bc;
  uint32_t local_7b8;
  uint32_t local_7b4;
  uint32_t local_7b0;
  uint32_t local_7ac;
  uint32_t local_7a8;
  allocator local_7a1;
  uint32_t local_7a0;
  allocator local_799;
  uint32_t locn_3;
  allocator local_771;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  allocator local_729;
  string local_728;
  allocator local_701;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  allocator local_6b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  uint32_t local_698;
  uint32_t local_694;
  uint32_t local_690;
  uint32_t local_68c;
  uint32_t local_688;
  uint32_t local_684;
  uint32_t local_680;
  uint32_t local_67c;
  uint32_t local_678;
  uint32_t local_674;
  string local_670;
  uint32_t local_650;
  uint32_t local_64c;
  uint32_t local_648;
  uint32_t local_644;
  string local_640;
  undefined1 local_620 [8];
  string quals_1;
  allocator local_5d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  uint32_t local_598;
  allocator local_591;
  uint32_t locn_2;
  allocator local_58a;
  allocator local_589;
  string local_588;
  allocator local_561;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  allocator local_519;
  string local_518;
  allocator local_4f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  uint32_t local_4b0;
  allocator local_4aa;
  allocator local_4a9;
  uint32_t locn_1;
  allocator local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  allocator local_419;
  string local_418;
  allocator local_3f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  allocator local_38e;
  allocator local_38d;
  uint local_38c;
  undefined1 local_388 [8];
  string loc_qual;
  string local_360;
  allocator local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  uint32_t local_2d4;
  uint32_t local_2d0;
  uint32_t local_2cc;
  string local_2c8;
  allocator local_2a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  uint32_t local_23c;
  uint32_t local_238;
  uint32_t local_234;
  string local_230;
  allocator local_209;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  byte local_1a4;
  allocator local_1a3;
  byte local_1a2;
  byte local_1a1;
  string local_1a0;
  byte local_17b;
  byte local_17a;
  allocator local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  allocator local_111;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  uint32_t local_d0;
  allocator local_c9;
  uint32_t locn;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  allocator local_5d [13];
  uint32_t local_50;
  uint32_t local_4c;
  char local_46;
  byte local_45;
  BuiltIn local_44;
  bool is_builtin;
  SPIRType *pSStack_40;
  BuiltIn builtin;
  SPIRType *mbr_type;
  SPIREntryPoint *pSStack_30;
  uint32_t mbr_type_id;
  SPIREntryPoint *execution;
  SPIRType *pSStack_20;
  uint32_t index_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  string *quals;
  
  execution._4_4_ = index;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  pSStack_30 = Compiler::get_entry_point((Compiler *)this);
  this_00 = (TypedID *)
            VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                      (&(pSStack_20->member_types).
                        super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                       (ulong)execution._4_4_);
  mbr_type._4_4_ = TypedID::operator_cast_to_unsigned_int(this_00);
  pSStack_40 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,mbr_type._4_4_);
  local_44 = BuiltInMax;
  local_45 = Compiler::is_member_builtin((Compiler *)this,pSStack_20,execution._4_4_,&local_44);
  uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
  bVar3 = Compiler::has_extended_member_decoration
                    ((Compiler *)this,uVar4,execution._4_4_,SPIRVCrossDecorationResourceIndexPrimary
                    );
  BVar2 = local_44;
  if (bVar3) {
    local_46 = '\0';
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    local_4c = Compiler::get_extended_member_decoration
                         ((Compiler *)this,uVar4,execution._4_4_,
                          SPIRVCrossDecorationResourceIndexPrimary);
    join<char_const(&)[7],unsigned_int,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)" [[id(",(char (*) [7])&local_4c,
               (uint *)0x4b01ae,(char (*) [2])in_R8);
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    local_50 = Compiler::get_extended_member_decoration
                         ((Compiler *)this,uVar4,execution._4_4_,SPIRVCrossDecorationInterfaceOrigID
                         );
    sVar5 = ::std::
            unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
            ::count(&(this->super_CompilerGLSL).super_Compiler.interlocked_resources,&local_50);
    if (sVar5 != 0) {
      ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", raster_order_group(0)")
      ;
    }
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"]]");
    return __return_storage_ptr__;
  }
  if ((pSStack_30->model == ExecutionModelVertex) && (pSStack_20->storage == StorageClassInput)) {
    if ((local_45 & 1) != 0) {
      if (((1 < local_44 - BuiltInVertexId) && (1 < local_44 - BuiltInVertexIndex)) &&
         (1 < local_44 - BuiltInBaseVertex)) {
        if (local_44 != BuiltInDrawIndex) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_c9);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_c9);
          return __return_storage_ptr__;
        }
        pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar6,"DrawIndex is not supported in MSL.");
        __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      if (((this->msl_options).vertex_for_tessellation & 1U) != 0) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_5d);
        ::std::allocator<char>::~allocator((allocator<char> *)local_5d);
        return __return_storage_ptr__;
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_a0," [[",&local_a1);
      builtin_qualifier_abi_cxx11_((string *)&locn,this,local_44);
      ::std::operator+(&local_80,&local_a0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locn);
      ::std::operator+(__return_storage_ptr__,&local_80,"]]");
      ::std::__cxx11::string::~string((string *)&local_80);
      ::std::__cxx11::string::~string((string *)&locn);
      ::std::__cxx11::string::~string((string *)&local_a0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_a1);
      return __return_storage_ptr__;
    }
    if ((local_45 & 1) == 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_d0 = get_member_location(this,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      in_R8 = (char (*) [4])0x0;
      local_d0 = get_or_allocate_builtin_input_member_location
                           (this,BVar2,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_d0 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_110," [[attribute(",&local_111);
      convert_to_string<unsigned_int,_0>(&local_138,&local_d0);
      ::std::operator+(&local_f0,&local_110,&local_138);
      ::std::operator+(__return_storage_ptr__,&local_f0,")]]");
      ::std::__cxx11::string::~string((string *)&local_f0);
      ::std::__cxx11::string::~string((string *)&local_138);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_111);
      return __return_storage_ptr__;
    }
  }
  if ((((pSStack_30->model == ExecutionModelVertex) &&
       (((this->msl_options).vertex_for_tessellation & 1U) == 0)) ||
      (bVar3 = is_tese_shader(this), bVar3)) && (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      switch(local_44) {
      case BuiltInPointSize:
        goto switchD_002a7c57_caseD_1;
      default:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)__return_storage_ptr__,"",
                   (allocator *)(loc_qual.field_2._M_local_buf + 0xf));
        ::std::allocator<char>::~allocator((allocator<char> *)(loc_qual.field_2._M_local_buf + 0xf))
        ;
        return __return_storage_ptr__;
      case BuiltInClipDistance:
        local_234 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_234,execution._4_4_,DecorationIndex);
        if (!bVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_2a0," [[",&local_2a1);
          builtin_qualifier_abi_cxx11_(&local_2c8,this,local_44);
          ::std::operator+(&local_280,&local_2a0,&local_2c8);
          ::std::operator+(&local_260,&local_280,"]]");
          bVar3 = VectorView<unsigned_int>::empty
                            (&(pSStack_40->array).super_VectorView<unsigned_int>);
          pcVar1 = "    ";
          if (bVar3) {
            pcVar1 = "\x05\x05\x04";
          }
          ::std::operator+(__return_storage_ptr__,&local_260,pcVar1 + 3);
          ::std::__cxx11::string::~string((string *)&local_260);
          ::std::__cxx11::string::~string((string *)&local_280);
          ::std::__cxx11::string::~string((string *)&local_2c8);
          ::std::__cxx11::string::~string((string *)&local_2a0);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
          return __return_storage_ptr__;
        }
        local_23c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        local_238 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)local_23c,execution._4_4_,DecorationIndex);
        join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                  (__return_storage_ptr__,(spirv_cross *)" [[user(clip",(char (*) [13])&local_238,
                   (uint *)")]]",in_R8);
        return __return_storage_ptr__;
      case BuiltInCullDistance:
        local_2cc = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_2cc,execution._4_4_,DecorationIndex);
        if (!bVar3) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)&local_338," [[",&local_339);
          builtin_qualifier_abi_cxx11_(&local_360,this,local_44);
          ::std::operator+(&local_318,&local_338,&local_360);
          ::std::operator+(&local_2f8,&local_318,"]]");
          bVar3 = VectorView<unsigned_int>::empty
                            (&(pSStack_40->array).super_VectorView<unsigned_int>);
          pcVar1 = "    ";
          if (bVar3) {
            pcVar1 = "\x05\x05\x04";
          }
          ::std::operator+(__return_storage_ptr__,&local_2f8,pcVar1 + 3);
          ::std::__cxx11::string::~string((string *)&local_2f8);
          ::std::__cxx11::string::~string((string *)&local_318);
          ::std::__cxx11::string::~string((string *)&local_360);
          ::std::__cxx11::string::~string((string *)&local_338);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_339);
          return __return_storage_ptr__;
        }
        local_2d4 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        local_2d0 = Compiler::get_member_decoration
                              ((Compiler *)this,(TypeID)local_2d4,execution._4_4_,DecorationIndex);
        join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                  (__return_storage_ptr__,(spirv_cross *)" [[user(cull",(char (*) [13])&local_2d0,
                   (uint *)")]]",in_R8);
        return __return_storage_ptr__;
      case BuiltInViewportIndex:
        bVar3 = Options::supports_msl_version(&this->msl_options,2,0,0);
        if (!bVar3) {
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar6,"ViewportIndex requires Metal 2.0.");
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      case BuiltInPosition:
      case BuiltInLayer:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_208," [[",&local_209);
        builtin_qualifier_abi_cxx11_(&local_230,this,local_44);
        ::std::operator+(&local_1e8,&local_208,&local_230);
        ::std::operator+(&local_1c8,&local_1e8,"]]");
        bVar3 = VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>)
        ;
        pcVar1 = "    ";
        if (bVar3) {
          pcVar1 = "\x05\x05\x04";
        }
        ::std::operator+(__return_storage_ptr__,&local_1c8,pcVar1 + 3);
        ::std::__cxx11::string::~string((string *)&local_1c8);
        ::std::__cxx11::string::~string((string *)&local_1e8);
        ::std::__cxx11::string::~string((string *)&local_230);
        ::std::__cxx11::string::~string((string *)&local_208);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_209);
        return __return_storage_ptr__;
      }
    }
    member_location_attribute_qualifier_abi_cxx11_
              ((string *)local_388,this,pSStack_20,execution._4_4_);
    uVar9 = ::std::__cxx11::string::empty();
    bVar3 = (uVar9 & 1) == 0;
    if (bVar3) {
      join<char_const(&)[4],std::__cxx11::string&,char_const(&)[3]>
                (__return_storage_ptr__,(spirv_cross *)" [[",(char (*) [4])local_388,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4a18e0,
                 (char (*) [3])in_R8);
    }
    local_38c = (uint)bVar3;
    ::std::__cxx11::string::~string((string *)local_388);
    if (local_38c != 0) {
      return __return_storage_ptr__;
    }
  }
  BVar2 = local_44;
  if (((pSStack_30->model == ExecutionModelVertex) &&
      (((this->msl_options).vertex_for_tessellation & 1U) != 0)) &&
     (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      get_or_allocate_builtin_output_member_location
                (this,BVar2,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_38d);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_38d);
    return __return_storage_ptr__;
  }
  bVar3 = is_tesc_shader(this);
  BVar2 = local_44;
  if ((bVar3) && (pSStack_20->storage == StorageClassInput)) {
    if ((local_45 & 1) != 0) {
      switch(local_44) {
      case BuiltInPrimitiveId:
      case BuiltInInvocationId:
        if (((this->msl_options).multi_patch_workgroup & 1U) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_38e);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_38e);
          return __return_storage_ptr__;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_3f0," [[",&local_3f1);
        builtin_qualifier_abi_cxx11_(&local_418,this,local_44);
        ::std::operator+(&local_3d0,&local_3f0,&local_418);
        ::std::operator+(&local_3b0,&local_3d0,"]]");
        bVar3 = VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>)
        ;
        pcVar1 = "    ";
        if (bVar3) {
          pcVar1 = "\x05\x05\x04";
        }
        ::std::operator+(__return_storage_ptr__,&local_3b0,pcVar1 + 3);
        ::std::__cxx11::string::~string((string *)&local_3b0);
        ::std::__cxx11::string::~string((string *)&local_3d0);
        ::std::__cxx11::string::~string((string *)&local_418);
        ::std::__cxx11::string::~string((string *)&local_3f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
        return __return_storage_ptr__;
      default:
        break;
      case BuiltInPatchVertices:
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_4a9);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
        return __return_storage_ptr__;
      case BuiltInSubgroupSize:
      case BuiltInSubgroupLocalInvocationId:
        if (((this->msl_options).emulate_subgroups & 1U) != 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_419);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_419);
          return __return_storage_ptr__;
        }
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_480," [[",&local_481);
        builtin_qualifier_abi_cxx11_((string *)&locn_1,this,local_44);
        ::std::operator+(&local_460,&local_480,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &locn_1);
        ::std::operator+(&local_440,&local_460,"]]");
        bVar3 = VectorView<unsigned_int>::empty(&(pSStack_40->array).super_VectorView<unsigned_int>)
        ;
        pcVar1 = "    ";
        if (bVar3) {
          pcVar1 = "\x05\x05\x04";
        }
        ::std::operator+(__return_storage_ptr__,&local_440,pcVar1 + 3);
        ::std::__cxx11::string::~string((string *)&local_440);
        ::std::__cxx11::string::~string((string *)&local_460);
        ::std::__cxx11::string::~string((string *)&locn_1);
        ::std::__cxx11::string::~string((string *)&local_480);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_481);
        return __return_storage_ptr__;
      }
    }
    if (((this->msl_options).multi_patch_workgroup & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_4aa);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4aa);
      return __return_storage_ptr__;
    }
    if ((local_45 & 1) == 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_4b0 = get_member_location(this,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      in_R8 = (char (*) [4])0x0;
      local_4b0 = get_or_allocate_builtin_input_member_location
                            (this,BVar2,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_4b0 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_4f0," [[attribute(",&local_4f1);
      convert_to_string<unsigned_int,_0>(&local_518,&local_4b0);
      ::std::operator+(&local_4d0,&local_4f0,&local_518);
      ::std::operator+(__return_storage_ptr__,&local_4d0,")]]");
      ::std::__cxx11::string::~string((string *)&local_4d0);
      ::std::__cxx11::string::~string((string *)&local_518);
      ::std::__cxx11::string::~string((string *)&local_4f0);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
      return __return_storage_ptr__;
    }
  }
  bVar3 = is_tesc_shader(this);
  BVar2 = local_44;
  if ((bVar3) && (pSStack_20->storage == StorageClassOutput)) {
    if ((local_45 & 1) != 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      get_or_allocate_builtin_output_member_location
                (this,BVar2,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_519);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_519);
    return __return_storage_ptr__;
  }
  bVar3 = is_tese_shader(this);
  if ((bVar3) && (pSStack_20->storage == StorageClassInput)) {
    if ((local_45 & 1) != 0) {
      if ((local_44 == BuiltInPrimitiveId) || (local_44 == BuiltInTessCoord)) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)&local_560," [[",&local_561);
        builtin_qualifier_abi_cxx11_(&local_588,this,local_44);
        ::std::operator+(&local_540,&local_560,&local_588);
        ::std::operator+(__return_storage_ptr__,&local_540,"]]");
        ::std::__cxx11::string::~string((string *)&local_540);
        ::std::__cxx11::string::~string((string *)&local_588);
        ::std::__cxx11::string::~string((string *)&local_560);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_561);
        return __return_storage_ptr__;
      }
      if (local_44 == BuiltInPatchVertices) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_589);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_589);
        return __return_storage_ptr__;
      }
    }
    if (((this->msl_options).raw_buffer_tese_input & 1U) != 0) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_58a);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_58a);
      return __return_storage_ptr__;
    }
    pTVar7 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                       (&(pSStack_20->member_types).
                         super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>,
                        (ulong)execution._4_4_);
    locn_2 = pTVar7->id;
    pSVar8 = Compiler::get_type((Compiler *)this,(TypeID)locn_2);
    BVar2 = local_44;
    if (pSVar8->basetype == ControlPointArray) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_591);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_591);
      return __return_storage_ptr__;
    }
    if ((local_45 & 1) == 0) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      local_598 = get_member_location(this,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    else {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
      in_R8 = (char (*) [4])0x0;
      local_598 = get_or_allocate_builtin_input_member_location
                            (this,BVar2,uVar4,execution._4_4_,(uint32_t *)0x0);
    }
    if (local_598 != 0xffffffff) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_5d8," [[attribute(",&local_5d9);
      convert_to_string<unsigned_int,_0>((string *)((long)&quals_1.field_2 + 8),&local_598);
      ::std::operator+(&local_5b8,&local_5d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&quals_1.field_2 + 8));
      ::std::operator+(__return_storage_ptr__,&local_5b8,")]]");
      ::std::__cxx11::string::~string((string *)&local_5b8);
      ::std::__cxx11::string::~string((string *)(quals_1.field_2._M_local_buf + 8));
      ::std::__cxx11::string::~string((string *)&local_5d8);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
      return __return_storage_ptr__;
    }
  }
  if ((pSStack_30->model == ExecutionModelFragment) && (pSStack_20->storage == StorageClassInput)) {
    ::std::__cxx11::string::string((string *)local_620);
    if ((local_45 & 1) == 0) {
      member_location_attribute_qualifier_abi_cxx11_(&local_670,this,pSStack_20,execution._4_4_);
      ::std::__cxx11::string::operator=((string *)local_620,(string *)&local_670);
      ::std::__cxx11::string::~string((string *)&local_670);
      goto LAB_002a949b;
    }
    if (local_44 == BuiltInClipDistance) {
      local_648 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_644 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)local_648,execution._4_4_,DecorationIndex);
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)" [[user(clip",(char (*) [13])&local_644,
                 (uint *)")]]",in_R8);
      local_38c = 1;
    }
    else if (local_44 == BuiltInCullDistance) {
      local_650 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_64c = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)local_650,execution._4_4_,DecorationIndex);
      join<char_const(&)[13],unsigned_int,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)" [[user(cull",(char (*) [13])&local_64c,
                 (uint *)")]]",in_R8);
      local_38c = 1;
    }
    else {
      if (((local_44 == BuiltInLayer) || (local_44 - BuiltInFragCoord < 4)) ||
         (local_44 == BuiltInSampleMask)) {
LAB_002a930d:
        builtin_qualifier_abi_cxx11_(&local_640,this,local_44);
        ::std::__cxx11::string::operator=((string *)local_620,(string *)&local_640);
        ::std::__cxx11::string::~string((string *)&local_640);
      }
      else if (local_44 == BuiltInViewIndex) {
        if ((((this->msl_options).multiview & 1U) != 0) &&
           (((this->msl_options).multiview_layered_rendering & 1U) != 0)) goto LAB_002a930d;
      }
      else if (local_44 - BuiltInBaryCoordKHR < 2) goto LAB_002a930d;
LAB_002a949b:
      if ((local_44 == BuiltInBaryCoordKHR) || (local_44 == BuiltInBaryCoordNoPerspKHR)) {
        local_674 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_674,execution._4_4_,DecorationFlat);
        local_99a = true;
        if (!bVar3) {
          local_678 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_20->super_IVariant).self);
          bVar3 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)local_678,execution._4_4_,DecorationCentroid);
          local_99a = true;
          if (!bVar3) {
            local_67c = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_20->super_IVariant).self);
            bVar3 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)local_67c,execution._4_4_,DecorationSample);
            local_99a = true;
            if (!bVar3) {
              local_680 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_20->super_IVariant).self);
              local_99a = Compiler::has_member_decoration
                                    ((Compiler *)this,(TypeID)local_680,execution._4_4_,
                                     DecorationNoPerspective);
            }
          }
        }
        if (local_99a != false) {
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError
                    (pCVar6,
                     "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs."
                    );
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
      }
      bVar3 = type_is_integral(pSStack_40);
      if ((!bVar3) && (((local_45 & 1) == 0 || (local_44 != BuiltInFragCoord)))) {
        local_684 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self)
        ;
        bVar3 = Compiler::has_member_decoration
                          ((Compiler *)this,(TypeID)local_684,execution._4_4_,DecorationFlat);
        if (bVar3) {
          uVar9 = ::std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            ::std::__cxx11::string::operator+=((string *)local_620,", ");
          }
          ::std::__cxx11::string::operator+=((string *)local_620,"flat");
        }
        else {
          local_688 = (uint32_t)
                      TypedID::operator_cast_to_TypedID
                                ((TypedID *)&(pSStack_20->super_IVariant).self);
          bVar3 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)local_688,execution._4_4_,DecorationCentroid);
          if (bVar3) {
            uVar9 = ::std::__cxx11::string::empty();
            if ((uVar9 & 1) == 0) {
              ::std::__cxx11::string::operator+=((string *)local_620,", ");
            }
            local_68c = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_20->super_IVariant).self);
            bVar3 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)local_68c,execution._4_4_,
                               DecorationNoPerspective);
            if (bVar3) {
              ::std::__cxx11::string::operator+=((string *)local_620,"centroid_no_perspective");
            }
            else {
              ::std::__cxx11::string::operator+=((string *)local_620,"centroid_perspective");
            }
          }
          else {
            local_690 = (uint32_t)
                        TypedID::operator_cast_to_TypedID
                                  ((TypedID *)&(pSStack_20->super_IVariant).self);
            bVar3 = Compiler::has_member_decoration
                              ((Compiler *)this,(TypeID)local_690,execution._4_4_,DecorationSample);
            if (bVar3) {
              uVar9 = ::std::__cxx11::string::empty();
              if ((uVar9 & 1) == 0) {
                ::std::__cxx11::string::operator+=((string *)local_620,", ");
              }
              local_694 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_20->super_IVariant).self);
              bVar3 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)local_694,execution._4_4_,
                                 DecorationNoPerspective);
              if (bVar3) {
                ::std::__cxx11::string::operator+=((string *)local_620,"sample_no_perspective");
              }
              else {
                ::std::__cxx11::string::operator+=((string *)local_620,"sample_perspective");
              }
            }
            else {
              local_698 = (uint32_t)
                          TypedID::operator_cast_to_TypedID
                                    ((TypedID *)&(pSStack_20->super_IVariant).self);
              bVar3 = Compiler::has_member_decoration
                                ((Compiler *)this,(TypeID)local_698,execution._4_4_,
                                 DecorationNoPerspective);
              if (bVar3) {
                uVar9 = ::std::__cxx11::string::empty();
                if ((uVar9 & 1) == 0) {
                  ::std::__cxx11::string::operator+=((string *)local_620,", ");
                }
                ::std::__cxx11::string::operator+=((string *)local_620,"center_no_perspective");
              }
            }
          }
        }
      }
      uVar9 = ::std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        ::std::operator+(&local_6b8," [[",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_620);
        ::std::operator+(__return_storage_ptr__,&local_6b8,"]]");
        ::std::__cxx11::string::~string((string *)&local_6b8);
        local_38c = 1;
      }
      else {
        local_38c = 0;
      }
    }
    ::std::__cxx11::string::~string((string *)local_620);
    if (local_38c != 0) {
      return __return_storage_ptr__;
    }
  }
  if ((pSStack_30->model == ExecutionModelFragment) && (pSStack_20->storage == StorageClassOutput))
  {
    if ((local_45 & 1) != 0) {
      if (local_44 != BuiltInSampleMask) {
        if (local_44 != BuiltInFragDepth) {
          if (local_44 != BuiltInFragStencilRefEXT) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_799);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_799);
            return __return_storage_ptr__;
          }
          if (((this->msl_options).enable_frag_stencil_ref_builtin & 1U) == 0) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_6b9);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_6b9);
            return __return_storage_ptr__;
          }
          bVar3 = Options::supports_msl_version(&this->msl_options,2,1,0);
          if (bVar3) {
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_700," [[",&local_701);
            builtin_qualifier_abi_cxx11_(&local_728,this,local_44);
            ::std::operator+(&local_6e0,&local_700,&local_728);
            ::std::operator+(__return_storage_ptr__,&local_6e0,"]]");
            ::std::__cxx11::string::~string((string *)&local_6e0);
            ::std::__cxx11::string::~string((string *)&local_728);
            ::std::__cxx11::string::~string((string *)&local_700);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_701);
            return __return_storage_ptr__;
          }
          pCVar6 = (CompilerError *)__cxa_allocate_exception(0x10);
          CompilerError::CompilerError(pCVar6,"Stencil export only supported in MSL 2.1 and up.");
          __cxa_throw(pCVar6,&CompilerError::typeinfo,CompilerError::~CompilerError);
        }
        if (((this->msl_options).enable_frag_depth_builtin & 1U) == 0) {
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_729);
          ::std::allocator<char>::~allocator((allocator<char> *)&local_729);
          return __return_storage_ptr__;
        }
      }
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_770," [[",&local_771);
      builtin_qualifier_abi_cxx11_((string *)&locn_3,this,local_44);
      ::std::operator+(&local_750,&local_770,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&locn_3)
      ;
      ::std::operator+(__return_storage_ptr__,&local_750,"]]");
      ::std::__cxx11::string::~string((string *)&local_750);
      ::std::__cxx11::string::~string((string *)&locn_3);
      ::std::__cxx11::string::~string((string *)&local_770);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_771);
      return __return_storage_ptr__;
    }
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(pSStack_20->super_IVariant).self);
    local_7a0 = get_member_location(this,uVar4,execution._4_4_,(uint32_t *)0x0);
    if ((local_7a0 != 0xffffffff) &&
       (((this->msl_options).enable_frag_output_mask & 1 << ((byte)local_7a0 & 0x1f)) == 0)) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_7a1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_7a1);
      return __return_storage_ptr__;
    }
    local_a31 = false;
    if (local_7a0 != 0xffffffff) {
      local_7a8 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_a31 = Compiler::has_member_decoration
                            ((Compiler *)this,(TypeID)local_7a8,execution._4_4_,DecorationIndex);
    }
    if (local_a31 == false) {
      if (local_7a0 != 0xffffffff) {
        join<char_const(&)[10],unsigned_int&,char_const(&)[4]>
                  (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&local_7a0,
                   (uint *)")]]",in_R8);
        return __return_storage_ptr__;
      }
      local_7b4 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      bVar3 = Compiler::has_member_decoration
                        ((Compiler *)this,(TypeID)local_7b4,execution._4_4_,DecorationIndex);
      if (!bVar3) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_7bd);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_7bd);
        return __return_storage_ptr__;
      }
      local_7bc = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
      local_7b8 = Compiler::get_member_decoration
                            ((Compiler *)this,(TypeID)local_7bc,execution._4_4_,DecorationIndex);
      join<char_const(&)[10],unsigned_int,char_const(&)[4]>
                (__return_storage_ptr__,(spirv_cross *)" [[index(",(char (*) [10])&local_7b8,
                 (uint *)")]]",in_R8);
      return __return_storage_ptr__;
    }
    local_7b0 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(pSStack_20->super_IVariant).self);
    local_7ac = Compiler::get_member_decoration
                          ((Compiler *)this,(TypeID)local_7b0,execution._4_4_,DecorationIndex);
    join<char_const(&)[10],unsigned_int&,char_const(&)[10],unsigned_int,char_const(&)[4]>
              (__return_storage_ptr__,(spirv_cross *)" [[color(",(char (*) [10])&local_7a0,
               (uint *)"), index(",(char (*) [10])&local_7ac,(uint *)")]]",in_stack_fffffffffffff598
              );
    return __return_storage_ptr__;
  }
  if (((pSStack_30->model == ExecutionModelGLCompute) && (pSStack_20->storage == StorageClassInput))
     && ((local_45 & 1) != 0)) {
    if ((local_44 != BuiltInNumWorkgroups) && (3 < local_44 - BuiltInWorkgroupId)) {
      if ((local_44 != BuiltInSubgroupSize) &&
         ((local_44 != BuiltInNumSubgroups &&
          (local_44 != BuiltInSubgroupId && local_44 != BuiltInSubgroupLocalInvocationId)))) {
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_829);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_829);
        return __return_storage_ptr__;
      }
      if (((this->msl_options).emulate_subgroups & 1U) != 0) goto LAB_002aa36a;
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_800," [[",&local_801);
    builtin_qualifier_abi_cxx11_(&local_828,this,local_44);
    ::std::operator+(&local_7e0,&local_800,&local_828);
    ::std::operator+(__return_storage_ptr__,&local_7e0,"]]");
    ::std::__cxx11::string::~string((string *)&local_7e0);
    ::std::__cxx11::string::~string((string *)&local_828);
    ::std::__cxx11::string::~string((string *)&local_800);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_801);
  }
  else {
LAB_002aa36a:
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_82a);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_82a);
  }
  return __return_storage_ptr__;
switchD_002a7c57_caseD_1:
  local_17a = 0;
  local_17b = 0;
  local_1a1 = 0;
  local_1a2 = 0;
  local_1a4 = 0;
  if (((this->msl_options).enable_point_size_builtin & 1U) == 0) {
    ::std::allocator<char>::allocator();
    local_1a4 = 1;
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1a3);
  }
  else {
    ::std::allocator<char>::allocator();
    local_17a = 1;
    ::std::__cxx11::string::string((string *)&local_178," [[",&local_179);
    local_17b = 1;
    builtin_qualifier_abi_cxx11_(&local_1a0,this,local_44);
    local_1a1 = 1;
    ::std::operator+(&local_158,&local_178,&local_1a0);
    local_1a2 = 1;
    ::std::operator+(__return_storage_ptr__,&local_158,"]]");
  }
  if ((local_1a4 & 1) != 0) {
    ::std::allocator<char>::~allocator((allocator<char> *)&local_1a3);
  }
  if ((local_1a2 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_158);
  }
  if ((local_1a1 & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_1a0);
  }
  if ((local_17b & 1) != 0) {
    ::std::__cxx11::string::~string((string *)&local_178);
  }
  if ((local_17a & 1) == 0) {
    return __return_storage_ptr__;
  }
  ::std::allocator<char>::~allocator((allocator<char> *)&local_179);
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::member_attribute_qualifier(const SPIRType &type, uint32_t index)
{
	auto &execution = get_entry_point();

	uint32_t mbr_type_id = type.member_types[index];
	auto &mbr_type = get<SPIRType>(mbr_type_id);

	BuiltIn builtin = BuiltInMax;
	bool is_builtin = is_member_builtin(type, index, &builtin);

	if (has_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary))
	{
		string quals = join(
		    " [[id(", get_extended_member_decoration(type.self, index, SPIRVCrossDecorationResourceIndexPrimary), ")");
		if (interlocked_resources.count(
		        get_extended_member_decoration(type.self, index, SPIRVCrossDecorationInterfaceOrigID)))
			quals += ", raster_order_group(0)";
		quals += "]]";
		return quals;
	}

	// Vertex function inputs
	if (execution.model == ExecutionModelVertex && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInVertexId:
			case BuiltInVertexIndex:
			case BuiltInBaseVertex:
			case BuiltInInstanceId:
			case BuiltInInstanceIndex:
			case BuiltInBaseInstance:
				if (msl_options.vertex_for_tessellation)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInDrawIndex:
				SPIRV_CROSS_THROW("DrawIndex is not supported in MSL.");

			default:
				return "";
			}
		}

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Vertex and tessellation evaluation function outputs
	if (((execution.model == ExecutionModelVertex && !msl_options.vertex_for_tessellation) || is_tese_shader()) &&
	    type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPointSize:
				// Only mark the PointSize builtin if really rendering points.
				// Some shaders may include a PointSize builtin even when used to render
				// non-point topologies, and Metal will reject this builtin when compiling
				// the shader into a render pipeline that uses a non-point topology.
				return msl_options.enable_point_size_builtin ? (string(" [[") + builtin_qualifier(builtin) + "]]") : "";

			case BuiltInViewportIndex:
				if (!msl_options.supports_msl_version(2, 0))
					SPIRV_CROSS_THROW("ViewportIndex requires Metal 2.0.");
				/* fallthrough */
			case BuiltInPosition:
			case BuiltInLayer:
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInClipDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			case BuiltInCullDistance:
				if (has_member_decoration(type.self, index, DecorationIndex))
					return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");
				else
					return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");

			default:
				return "";
			}
		}
		string loc_qual = member_location_attribute_qualifier(type, index);
		if (!loc_qual.empty())
			return join(" [[", loc_qual, "]]");
	}

	if (execution.model == ExecutionModelVertex && msl_options.vertex_for_tessellation && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation control function inputs
	if (is_tesc_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInInvocationId:
			case BuiltInPrimitiveId:
				if (msl_options.multi_patch_workgroup)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					return "";
				return string(" [[") + builtin_qualifier(builtin) + "]]" + (mbr_type.array.empty() ? "" : " ");
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}
		if (msl_options.multi_patch_workgroup)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation control function outputs
	if (is_tesc_shader() && type.storage == StorageClassOutput)
	{
		// For this type of shader, we always arrange for it to capture its
		// output to a buffer. For this reason, qualifiers are irrelevant here.
		if (is_builtin)
			// We still have to assign a location so the output struct will sort correctly.
			get_or_allocate_builtin_output_member_location(builtin, type.self, index);
		return "";
	}

	// Tessellation evaluation function inputs
	if (is_tese_shader() && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInPrimitiveId:
			case BuiltInTessCoord:
				return string(" [[") + builtin_qualifier(builtin) + "]]";
			case BuiltInPatchVertices:
				return "";
			// Others come from stage input.
			default:
				break;
			}
		}

		if (msl_options.raw_buffer_tese_input)
			return "";

		// The special control point array must not be marked with an attribute.
		if (get_type(type.member_types[index]).basetype == SPIRType::ControlPointArray)
			return "";

		uint32_t locn;
		if (is_builtin)
			locn = get_or_allocate_builtin_input_member_location(builtin, type.self, index);
		else
			locn = get_member_location(type.self, index);

		if (locn != k_unknown_location)
			return string(" [[attribute(") + convert_to_string(locn) + ")]]";
	}

	// Tessellation evaluation function outputs were handled above.

	// Fragment function inputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassInput)
	{
		string quals;
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInViewIndex:
				if (!msl_options.multiview || !msl_options.multiview_layered_rendering)
					break;
				/* fallthrough */
			case BuiltInFrontFacing:
			case BuiltInPointCoord:
			case BuiltInFragCoord:
			case BuiltInSampleId:
			case BuiltInSampleMask:
			case BuiltInLayer:
			case BuiltInBaryCoordKHR:
			case BuiltInBaryCoordNoPerspKHR:
				quals = builtin_qualifier(builtin);
				break;

			case BuiltInClipDistance:
				return join(" [[user(clip", get_member_decoration(type.self, index, DecorationIndex), ")]]");
			case BuiltInCullDistance:
				return join(" [[user(cull", get_member_decoration(type.self, index, DecorationIndex), ")]]");

			default:
				break;
			}
		}
		else
			quals = member_location_attribute_qualifier(type, index);

		if (builtin == BuiltInBaryCoordKHR || builtin == BuiltInBaryCoordNoPerspKHR)
		{
			if (has_member_decoration(type.self, index, DecorationFlat) ||
			    has_member_decoration(type.self, index, DecorationCentroid) ||
			    has_member_decoration(type.self, index, DecorationSample) ||
			    has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				// NoPerspective is baked into the builtin type.
				SPIRV_CROSS_THROW(
				    "Flat, Centroid, Sample, NoPerspective decorations are not supported for BaryCoord inputs.");
			}
		}

		// Don't bother decorating integers with the 'flat' attribute; it's
		// the default (in fact, the only option). Also don't bother with the
		// FragCoord builtin; it's always noperspective on Metal.
		if (!type_is_integral(mbr_type) && (!is_builtin || builtin != BuiltInFragCoord))
		{
			if (has_member_decoration(type.self, index, DecorationFlat))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "flat";
			}
			else if (has_member_decoration(type.self, index, DecorationCentroid))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "centroid_no_perspective";
				else
					quals += "centroid_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationSample))
			{
				if (!quals.empty())
					quals += ", ";
				if (has_member_decoration(type.self, index, DecorationNoPerspective))
					quals += "sample_no_perspective";
				else
					quals += "sample_perspective";
			}
			else if (has_member_decoration(type.self, index, DecorationNoPerspective))
			{
				if (!quals.empty())
					quals += ", ";
				quals += "center_no_perspective";
			}
		}

		if (!quals.empty())
			return " [[" + quals + "]]";
	}

	// Fragment function outputs
	if (execution.model == ExecutionModelFragment && type.storage == StorageClassOutput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInFragStencilRefEXT:
				// Similar to PointSize, only mark FragStencilRef if there's a stencil buffer.
				// Some shaders may include a FragStencilRef builtin even when used to render
				// without a stencil attachment, and Metal will reject this builtin
				// when compiling the shader into a render pipeline that does not set
				// stencilAttachmentPixelFormat.
				if (!msl_options.enable_frag_stencil_ref_builtin)
					return "";
				if (!msl_options.supports_msl_version(2, 1))
					SPIRV_CROSS_THROW("Stencil export only supported in MSL 2.1 and up.");
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			case BuiltInFragDepth:
				// Ditto FragDepth.
				if (!msl_options.enable_frag_depth_builtin)
					return "";
				/* fallthrough */
			case BuiltInSampleMask:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
		uint32_t locn = get_member_location(type.self, index);
		// Metal will likely complain about missing color attachments, too.
		if (locn != k_unknown_location && !(msl_options.enable_frag_output_mask & (1 << locn)))
			return "";
		if (locn != k_unknown_location && has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[color(", locn, "), index(", get_member_decoration(type.self, index, DecorationIndex),
			            ")]]");
		else if (locn != k_unknown_location)
			return join(" [[color(", locn, ")]]");
		else if (has_member_decoration(type.self, index, DecorationIndex))
			return join(" [[index(", get_member_decoration(type.self, index, DecorationIndex), ")]]");
		else
			return "";
	}

	// Compute function inputs
	if (execution.model == ExecutionModelGLCompute && type.storage == StorageClassInput)
	{
		if (is_builtin)
		{
			switch (builtin)
			{
			case BuiltInNumSubgroups:
			case BuiltInSubgroupId:
			case BuiltInSubgroupLocalInvocationId: // FIXME: Should work in any stage
			case BuiltInSubgroupSize: // FIXME: Should work in any stage
				if (msl_options.emulate_subgroups)
					break;
				/* fallthrough */
			case BuiltInGlobalInvocationId:
			case BuiltInWorkgroupId:
			case BuiltInNumWorkgroups:
			case BuiltInLocalInvocationId:
			case BuiltInLocalInvocationIndex:
				return string(" [[") + builtin_qualifier(builtin) + "]]";

			default:
				return "";
			}
		}
	}

	return "";
}